

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_collect_reduce(size_t target_size)

{
  mi_heap_t *max;
  ulong in_RDI;
  undefined4 unaff_retaddr;
  mi_option_t unaff_retaddr_00;
  size_t target;
  mi_segments_tld_t *tld;
  mi_heap_t *heap;
  
  mi_collect(false);
  max = mi_heap_get_default();
  if (in_RDI >> 0x19 == 0) {
    mi_option_get_clamp(unaff_retaddr_00,in_RDI,(long)max);
  }
  mi_segments_try_abandon_to_target
            ((mi_heap_t *)tld,target,(mi_segments_tld_t *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  return;
}

Assistant:

void mi_collect_reduce(size_t target_size) mi_attr_noexcept {
  mi_collect(true);
  mi_heap_t* heap = mi_heap_get_default();
  mi_segments_tld_t* tld = &heap->tld->segments;
  size_t target = target_size / MI_SEGMENT_SIZE;
  if (target == 0) {
    target = (size_t)mi_option_get_clamp(mi_option_target_segments_per_thread, 1, 1024);
  }
  mi_segments_try_abandon_to_target(heap, target, tld);
}